

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O1

uint64_t __thiscall r_exec::HLPController::get_requirement_count(HLPController *this)

{
  mutex *__mutex;
  uint64_t uVar1;
  int iVar2;
  
  __mutex = &(this->super_OController).super_Controller.m_reductionMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    uVar1 = this->requirement_count;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return uVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

uint64_t HLPController::get_requirement_count()
{
    uint64_t r_c;
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_c = requirement_count;
    return r_c;
}